

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O3

string * __thiscall
flatbuffers::jsons::JsonSchemaGenerator::PrepareDescription
          (string *__return_storage_ptr__,JsonSchemaGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *comment_lines)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  pointer pbVar5;
  string comment;
  string local_88;
  char *local_68;
  ulong local_60;
  char local_58;
  undefined7 uStack_57;
  string *local_48;
  char *local_40;
  pointer local_38;
  
  local_68 = &local_58;
  local_60 = 0;
  local_58 = '\0';
  pbVar5 = (comment_lines->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar5 != (comment_lines->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_48 = __return_storage_ptr__;
    do {
      pcVar2 = (pbVar5->_M_dataplus)._M_p;
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<flatbuffers::jsons::JsonSchemaGenerator::PrepareDescription(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(char)_1_>>
                        (pcVar2,pcVar2 + pbVar5->_M_string_length);
      local_38 = (pbVar5->_M_dataplus)._M_p;
      local_88._M_dataplus._M_p = local_38 + pbVar5->_M_string_length;
      std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<flatbuffers::jsons::JsonSchemaGenerator::PrepareDescription(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(char)_2_>>
                (&local_40,&local_88,&local_38);
      if (_Var4._M_current < local_40) {
        std::__cxx11::string::replace((ulong)&local_68,local_60,(char *)0x0,(ulong)_Var4._M_current)
        ;
      }
      else {
        std::__cxx11::string::_M_append((char *)&local_68,(ulong)(pbVar5->_M_dataplus)._M_p);
      }
      pbVar5 = pbVar5 + 1;
      if (pbVar5 == (comment_lines->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) break;
      std::__cxx11::string::append((char *)&local_68);
    } while (pbVar5 != (comment_lines->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    __return_storage_ptr__ = local_48;
    if (local_60 != 0) {
      paVar1 = &local_88.field_2;
      local_88._M_string_length = 0;
      local_88.field_2._M_local_buf[0] = '\0';
      local_88._M_dataplus._M_p = (pointer)paVar1;
      bVar3 = EscapeString(local_68,local_60,&local_88,true,true);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (bVar3) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p == paVar1) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                        local_88.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_88.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = local_88._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                        local_88.field_2._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = local_88._M_string_length;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p,
                          CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                   local_88.field_2._M_local_buf[0]) + 1);
        }
      }
      goto LAB_002d612f;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_002d612f:
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PrepareDescription(
      const std::vector<std::string> &comment_lines) {
    std::string comment;
    for (auto line_iterator = comment_lines.cbegin();
         line_iterator != comment_lines.cend(); ++line_iterator) {
      const auto &comment_line = *line_iterator;

      // remove leading and trailing spaces from comment line
      const auto start = std::find_if(comment_line.begin(), comment_line.end(),
                                      [](char c) { return !isspace(c); });
      const auto end =
          std::find_if(comment_line.rbegin(), comment_line.rend(), [](char c) {
            return !isspace(c);
          }).base();
      if (start < end) {
        comment.append(start, end);
      } else {
        comment.append(comment_line);
      }

      if (line_iterator + 1 != comment_lines.cend()) comment.append("\n");
    }
    if (!comment.empty()) {
      std::string description;
      if (EscapeString(comment.c_str(), comment.length(), &description, true,
                       true)) {
        return description;
      }
      return "";
    }
    return "";
  }